

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

ImplementsClauseSyntax * __thiscall
slang::parsing::Parser::parseImplementsClause(Parser *this,TokenKind keywordKind,Token *semi)

{
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> elements;
  Token keyword;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  EVP_PKEY_CTX *src;
  size_type extraout_RDX;
  Token TVar3;
  SeparatedSyntaxList<slang::syntax::NameSyntax> local_188;
  char local_158 [8];
  Info *pIStack_150;
  anon_class_8_1_8991fb9c local_130;
  undefined4 local_124;
  undefined1 local_120 [8];
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> buffer;
  Token implements;
  Info *local_30;
  Token *semi_local;
  TokenKind keywordKind_local;
  Parser *this_local;
  
  bVar1 = ParserBase::peek(&this->super_ParserBase,keywordKind);
  if (bVar1) {
    join_0x00000010_0x00000000_ = ParserBase::consume(&this->super_ParserBase);
    SmallVector<slang::syntax::TokenOrSyntax,_8UL>::SmallVector
              ((SmallVector<slang::syntax::TokenOrSyntax,_8UL> *)local_120);
    local_124 = 0x340005;
    local_130.this = this;
    ParserBase::
    parseList<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isSemicolon,slang::parsing::Parser::parseImplementsClause(slang::parsing::TokenKind,slang::parsing::Token&)::__0>
              (&this->super_ParserBase,(SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_120,
               Semicolon,Comma,semi,True,(DiagCode)0x340005,&local_130,False);
    TVar3 = stack0xffffffffffffffb8;
    local_158[0] = buffer.stackBase[0xa0];
    local_158[1] = buffer.stackBase[0xa1];
    local_158[2] = buffer.stackBase[0xa2];
    local_158[3] = buffer.stackBase[0xa3];
    local_158[4] = buffer.stackBase[0xa4];
    local_158[5] = buffer.stackBase[0xa5];
    local_158[6] = buffer.stackBase[0xa6];
    local_158[7] = buffer.stackBase[0xa7];
    pIStack_150 = (Info *)implements._0_8_;
    unique0x100001c0 = TVar3;
    iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                      ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_120,
                       (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
    elements.data_._4_4_ = extraout_var;
    elements.data_._0_4_ = iVar2;
    elements.size_ = extraout_RDX;
    slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::SeparatedSyntaxList
              (&local_188,elements);
    keyword.info = pIStack_150;
    keyword._0_8_ = local_158;
    this_local = (Parser *)
                 slang::syntax::SyntaxFactory::implementsClause(&this->factory,keyword,&local_188);
    SmallVector<slang::syntax::TokenOrSyntax,_8UL>::~SmallVector
              ((SmallVector<slang::syntax::TokenOrSyntax,_8UL> *)local_120);
  }
  else {
    TVar3 = ParserBase::expect(&this->super_ParserBase,Semicolon);
    implements.info = TVar3._0_8_;
    *(Info **)semi = implements.info;
    local_30 = TVar3.info;
    semi->info = local_30;
    this_local = (Parser *)0x0;
  }
  return (ImplementsClauseSyntax *)this_local;
}

Assistant:

ImplementsClauseSyntax* Parser::parseImplementsClause(TokenKind keywordKind, Token& semi) {
    if (!peek(keywordKind)) {
        semi = expect(TokenKind::Semicolon);
        return nullptr;
    }

    auto implements = consume();
    SmallVector<TokenOrSyntax, 8> buffer;
    parseList<isPossibleExpressionOrComma, isSemicolon>(buffer, TokenKind::Semicolon,
                                                        TokenKind::Comma, semi, RequireItems::True,
                                                        diag::ExpectedInterfaceClassName,
                                                        [this] { return &parseName(); });

    return &factory.implementsClause(implements, buffer.copy(alloc));
}